

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall httplib::Server::stop(Server *this)

{
  __integral_type __i;
  bool bVar1;
  __int_type _Var2;
  atomic<int> local_2c;
  Server *pSStack_28;
  atomic<int> sock;
  Server *this_local;
  
  pSStack_28 = this;
  bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->is_running_);
  if (bVar1) {
    _Var2 = std::__atomic_base::operator_cast_to_int((__atomic_base *)&this->svr_sock_);
    if (_Var2 == -1) {
      __assert_fail("svr_sock_ != INVALID_SOCKET",
                    "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h"
                    ,0x135d,"void httplib::Server::stop()");
    }
    LOCK();
    __i = (this->svr_sock_).super___atomic_base<int>._M_i;
    (this->svr_sock_).super___atomic_base<int>._M_i = -1;
    UNLOCK();
    std::atomic<int>::atomic(&local_2c,__i);
    _Var2 = std::__atomic_base::operator_cast_to_int((__atomic_base *)&local_2c);
    detail::shutdown_socket(_Var2);
    _Var2 = std::__atomic_base::operator_cast_to_int((__atomic_base *)&local_2c);
    detail::close_socket(_Var2);
  }
  return;
}

Assistant:

inline void Server::stop() {
  if (is_running_) {
    assert(svr_sock_ != INVALID_SOCKET);
    std::atomic<socket_t> sock(svr_sock_.exchange(INVALID_SOCKET));
    detail::shutdown_socket(sock);
    detail::close_socket(sock);
  }
}